

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mocker::ir::Interpreter::executePhis
          (Interpreter *this,
          vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
          *phis)

{
  pointer this_00;
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  __shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar4;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *this_02;
  element_type *this_03;
  size_t sVar5;
  shared_ptr<mocker::ir::Reg> *__args;
  reference reg;
  Change *change;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Change,_std::allocator<Change>_> *__range2_1;
  vector<Change,_std::allocator<Change>_> *local_98;
  int64_t val;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range3;
  bool found;
  shared_ptr<mocker::ir::Phi> *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
  *__range2;
  value_type *ar;
  vector<Change,_std::allocator<Change>_> changes;
  vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
  *phis_local;
  Interpreter *this_local;
  
  changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)phis;
  std::vector<Change,_std::allocator<Change>_>::vector
            ((vector<Change,_std::allocator<Change>_> *)&ar);
  pvVar3 = std::
           stack<mocker::ir::Interpreter::ActivationRecord,_std::deque<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>_>
           ::top(&this->ars);
  this_00 = changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
           ::begin((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                    *)changes.super__Vector_base<Change,_std::allocator<Change>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  p = (shared_ptr<mocker::ir::Phi> *)
      std::
      vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>::
      end((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
           *)this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::ir::Phi>_*,_std::vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>_>
                                *)&p);
    if (!bVar1) {
      __end2_1 = std::vector<Change,_std::allocator<Change>_>::begin
                           ((vector<Change,_std::allocator<Change>_> *)&ar);
      change = (Change *)
               std::vector<Change,_std::allocator<Change>_>::end
                         ((vector<Change,_std::allocator<Change>_> *)&ar);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<Change_*,_std::vector<Change,_std::allocator<Change>_>_>
                                 *)&change), bVar1) {
        reg = __gnu_cxx::__normal_iterator<Change_*,_std::vector<Change,_std::allocator<Change>_>_>
              ::operator*(&__end2_1);
        writeReg<long>(this,&reg->reg,reg->val);
        __gnu_cxx::__normal_iterator<Change_*,_std::vector<Change,_std::allocator<Change>_>_>::
        operator++(&__end2_1);
      }
      std::vector<Change,_std::allocator<Change>_>::~vector
                ((vector<Change,_std::allocator<Change>_> *)&ar);
      return;
    }
    this_01 = (__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<mocker::ir::Phi>_*,_std::vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>_>
              ::operator*(&__end2);
    bVar1 = false;
    peVar4 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    this_02 = Phi::getOptions(peVar4);
    __end3 = std::
             vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
             ::begin(this_02);
    option = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
             std::
             vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
             ::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                       *)&option), bVar2) {
      val = (int64_t)__gnu_cxx::
                     __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                     ::operator*(&__end3);
      this_03 = std::
                __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&((reference)val)->second);
      sVar5 = Label::getID(this_03);
      if (sVar5 == pvVar3->lastBB) {
        local_98 = (vector<Change,_std::allocator<Change>_> *)
                   readVal(this,(shared_ptr<mocker::ir::Addr> *)val);
        peVar4 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(this_01);
        __args = Definition::getDest(&peVar4->super_Definition);
        __range2_1 = local_98;
        std::
        vector<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change,std::allocator<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change>>
        ::emplace_back<std::shared_ptr<mocker::ir::Reg>const&,long>
                  ((vector<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change,std::allocator<mocker::ir::Interpreter::executePhis(std::vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>const&)::Change>>
                    *)&ar,__args,(long *)&__range2_1);
        bVar1 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
      ::operator++(&__end3);
    }
    if (!bVar1) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                    ,0x1bb,
                    "void mocker::ir::Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<mocker::ir::Phi>_*,_std::vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void Interpreter::executePhis(const std::vector<std::shared_ptr<Phi>> &phis) {
  struct Change {
    Change(std::shared_ptr<Addr> reg, int64_t val)
        : reg(std::move(reg)), val(val) {}
    std::shared_ptr<Addr> reg;
    std::int64_t val;
  };
  std::vector<Change> changes;
  auto &ar = ars.top();

  for (const auto &p : phis) {
    bool found = false;
    for (auto &option : p->getOptions()) {
      if (option.second->getID() == ar.lastBB) {
        auto val = readVal(option.first);
        changes.emplace_back(p->getDest(), (std::int64_t)val);
        found = true;
        break;
      }
    }
    assert(found);
  }

  for (const auto &change : changes) {
    writeReg(change.reg, change.val);
  }
}